

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O1

void __thiscall
pstore::random_generator<unsigned_short>::random_generator(random_generator<unsigned_short> *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  std::random_device::random_device(&this->device_);
  uVar1 = std::random_device::_M_getval();
  uVar5 = (ulong)uVar1;
  (this->generator_)._M_x[0] = uVar5;
  lVar2 = 1;
  lVar3 = 0;
  do {
    lVar4 = (uVar5 >> 0x3e ^ uVar5) * 0x5851f42d4c957f2d;
    uVar5 = lVar4 + lVar2;
    (this->generator_)._M_x[lVar3 + 1] = lVar3 + lVar4 + 1;
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x137);
  (this->generator_)._M_p = 0x138;
  (this->distribution_)._M_param = (param_type)0xffff0000;
  return;
}

Assistant:

random_generator ()
                : generator_ (device_ ()) {}